

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O0

optional<Vault::HttpResponse> * __thiscall
Vault::HttpClient::put
          (optional<Vault::HttpResponse> *__return_storage_ptr__,HttpClient *this,Url *url,
          Token *token,Namespace *ns,string *value)

{
  anon_class_1_0_00000001 local_81;
  CurlHeaderCallback local_80;
  anon_class_8_1_a8c68091 local_60;
  CurlSetupCallback local_58;
  string *local_38;
  string *value_local;
  Namespace *ns_local;
  Token *token_local;
  Url *url_local;
  HttpClient *this_local;
  
  local_60.value = value;
  local_38 = value;
  value_local = &ns->value_;
  ns_local = (Namespace *)token;
  token_local = (Token *)url;
  url_local = (Url *)this;
  this_local = (HttpClient *)__return_storage_ptr__;
  std::function<void(void*)>::
  function<Vault::HttpClient::put(Vault::Tiny<Vault::UrlDetail,std::__cxx11::string>const&,Vault::Tiny<Vault::TokenDetail,std::__cxx11::string>const&,Vault::Tiny<Vault::NamespaceDetail,std::__cxx11::string>const&,std::__cxx11::string_const&)const::__0,void>
            ((function<void(void*)> *)&local_58,&local_60);
  std::function<curl_slist*(curl_slist*)>::
  function<Vault::HttpClient::put(Vault::Tiny<Vault::UrlDetail,std::__cxx11::string>const&,Vault::Tiny<Vault::TokenDetail,std::__cxx11::string>const&,Vault::Tiny<Vault::NamespaceDetail,std::__cxx11::string>const&,std::__cxx11::string_const&)const::__1,void>
            ((function<curl_slist*(curl_slist*)> *)&local_80,&local_81);
  executeRequest(__return_storage_ptr__,this,url,token,ns,&local_58,&local_80,&this->errorCallback_)
  ;
  std::function<curl_slist_*(curl_slist_*)>::~function(&local_80);
  std::function<void_(void_*)>::~function(&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::optional<Vault::HttpResponse>
Vault::HttpClient::put(const Vault::Url &url, const Vault::Token &token,
                       const Vault::Namespace &ns,
                       const std::string &value) const {
  return executeRequest(
      url, token, ns,
      [&](CURL *curl) {
        curl_easy_setopt(curl, CURLOPT_CUSTOMREQUEST, "PUT");
        curl_easy_setopt(curl, CURLOPT_POSTFIELDS, value.c_str());
      },
      [&](curl_slist *chunk) { return chunk; }, errorCallback_);
}